

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoopThread::~EventLoopThread(EventLoopThread *this)

{
  _Manager_type p_Var1;
  
  this->m_exiting = true;
  if (this->m_loop != (EventLoop *)0x0) {
    EventLoop::quit(this->m_loop);
    Thread::join(&this->m_thread);
  }
  p_Var1 = (this->m_callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_callback,(_Any_data *)&this->m_callback,__destroy_functor);
  }
  sz_cond_fini(&(this->m_cond).m_cond);
  MutexLock::~MutexLock(&this->m_mutex);
  Thread::~Thread(&this->m_thread);
  return;
}

Assistant:

EventLoopThread::~EventLoopThread()
{
	m_exiting = true;
	if (m_loop != nullptr)
	{
		// 通知完成以后就等
		m_loop->quit();
		m_thread.join();
	}
}